

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# focuser_state.cpp
# Opt level: O2

void __thiscall FS::Focuser::setMotor(Focuser *this,WifiDebugOstream *log,MotorState m)

{
  HWI *pHVar1;
  WifiDebugOstream *pWVar2;
  char *string;
  
  this->motorState = m;
  pHVar1 = (this->hardware)._M_t.super___uniq_ptr_impl<HWI,_std::default_delete<HWI>_>._M_t.
           super__Tuple_impl<0UL,_HWI_*,_std::default_delete<HWI>_>.
           super__Head_base<0UL,_HWI_*,_false>._M_head_impl;
  string = "off";
  if (m == ON) {
    string = "on";
  }
  (*pHVar1->_vptr_HWI[2])(pHVar1,2,(ulong)(m == ON ^ 5));
  pWVar2 = ::operator<<(log,"Motor set ");
  pWVar2 = ::operator<<(pWVar2,string);
  ::operator<<(pWVar2,"\n");
  return;
}

Assistant:

void Focuser::setMotor( WifiDebugOstream& log, MotorState m )
{
  motorState = m;

  hardware->DigitalWrite( HWI::Pin::MOTOR_ENA, ( m == MotorState::ON ) ?
      HWI::PinState::MOTOR_ON :
      HWI::PinState::MOTOR_OFF );

  log << "Motor set " << (( m == MotorState::ON ) ? "on" : "off" ) << "\n";
}